

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectDictionaryNextItem
                    (JlDataObject *DictionaryObject,JlDataObject **pNextObject,char **pKeyName,
                    JlDictionaryItem **pEnumerator)

{
  JL_STATUS local_2c;
  JL_STATUS jlStatus;
  JlDictionaryItem **pEnumerator_local;
  char **pKeyName_local;
  JlDataObject **pNextObject_local;
  JlDataObject *DictionaryObject_local;
  
  if ((((DictionaryObject == (JlDataObject *)0x0) || (pNextObject == (JlDataObject **)0x0)) ||
      (pKeyName == (char **)0x0)) || (pEnumerator == (JlDictionaryItem **)0x0)) {
    local_2c = JL_STATUS_INVALID_PARAMETER;
  }
  else if ((DictionaryObject->Type == JL_DATA_TYPE_DICTIONARY) &&
          ((*pEnumerator == (JlDictionaryItem *)0x0 ||
           ((*pEnumerator)->ParentDictionary == (JlDictionary *)&DictionaryObject->field_2)))) {
    if (*pEnumerator == (JlDictionaryItem *)0x0) {
      *pEnumerator = (JlDictionaryItem *)(DictionaryObject->field_2).String;
      if ((DictionaryObject->field_2).String == (char *)0x0) {
        *pNextObject = (JlDataObject *)0x0;
        *pKeyName = (char *)0x0;
        local_2c = JL_STATUS_END_OF_DATA;
      }
      else {
        *pNextObject = ((DictionaryObject->field_2).Dictionary.DictionaryHead)->Object;
        *pKeyName = ((DictionaryObject->field_2).Dictionary.DictionaryHead)->KeyName;
        local_2c = JL_STATUS_SUCCESS;
      }
    }
    else {
      *pEnumerator = (*pEnumerator)->Next;
      if (*pEnumerator == (JlDictionaryItem *)0x0) {
        *pNextObject = (JlDataObject *)0x0;
        *pKeyName = (char *)0x0;
        local_2c = JL_STATUS_END_OF_DATA;
      }
      else {
        *pNextObject = (*pEnumerator)->Object;
        *pKeyName = (*pEnumerator)->KeyName;
        local_2c = JL_STATUS_SUCCESS;
      }
    }
  }
  else {
    local_2c = JL_STATUS_WRONG_TYPE;
  }
  return local_2c;
}

Assistant:

JL_STATUS
    JlGetObjectDictionaryNextItem
    (
        JlDataObject const*       DictionaryObject,
        JlDataObject**            pNextObject,
        char const**              pKeyName,
        JlDictionaryItem**        pEnumerator
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != pNextObject
        &&  NULL != pKeyName
        &&  NULL != pEnumerator )
    {
        if(     JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type
            &&  ( NULL == *pEnumerator  || (*pEnumerator)->ParentDictionary == &DictionaryObject->Dictionary ) )
        {
            if( NULL == *pEnumerator )
            {
                // Get first item
                *pEnumerator = DictionaryObject->Dictionary.DictionaryHead;
                if( NULL != DictionaryObject->Dictionary.DictionaryHead )
                {
                    *pNextObject = DictionaryObject->Dictionary.DictionaryHead->Object;
                    *pKeyName    = DictionaryObject->Dictionary.DictionaryHead->KeyName;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    // Empty dictionary
                    *pNextObject = NULL;
                    *pKeyName = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
            else
            {
                // Move enumerator to next item.
                *pEnumerator = (*pEnumerator)->Next;
                if( NULL != *pEnumerator )
                {
                    *pNextObject = (*pEnumerator)->Object;
                    *pKeyName    = (*pEnumerator)->KeyName;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    *pKeyName    = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}